

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::addTimingEvent
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,time_point queuedTime,
          string *tag,cl_command_queue queue,cl_event event)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  pthread_mutex_t *__mutex;
  float __x;
  cl_device_id device;
  cl_ulong hostTimeNS;
  allocator local_79;
  _List_node_base *local_78;
  pthread_mutex_t *local_70;
  cl_command_queue local_68;
  duration local_60;
  _List_node_base *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_68 = queue;
  local_58 = (_List_node_base *)enqueueCounter;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    uVar8 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(local_70);
    _Unwind_Resume(uVar8);
  }
  if (event == (cl_event)0x0) {
    logf(this,__x);
  }
  else {
    local_60 = queuedTime.__d.__r;
    std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::
    _M_insert<>(&this->m_EventList,(iterator)&this->m_EventList);
    p_Var1 = (this->m_EventList).
             super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_78 = (_List_node_base *)0x0;
    local_70 = __mutex;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(local_68,0x1091,8,&local_78,(size_t *)0x0);
    cacheDeviceInfo(this,(cl_device_id)local_78);
    (*(this->m_Dispatch).clRetainEvent)(event);
    p_Var1[1]._M_next = local_78;
    pmVar4 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](&this->m_QueueNumberMap,&local_68);
    *(mapped_type *)&p_Var1[1]._M_prev = *pmVar4;
    if (tag->_M_string_length == 0) {
      std::__cxx11::string::string((string *)local_50,functionName,&local_79);
    }
    else {
      local_50[0] = local_40;
      pcVar2 = (tag->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + tag->_M_string_length);
    }
    std::__cxx11::string::_M_assign((string *)(p_Var1 + 2));
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    p_Var1[4]._M_next = local_58;
    p_Var1[4]._M_prev = (_List_node_base *)local_60.__r;
    *(undefined1 *)&p_Var1[5]._M_next = 0;
    p_Var1[5]._M_prev = (_List_node_base *)0x0;
    p_Var1[6]._M_next = (_List_node_base *)event;
    __mutex = local_70;
    if ((local_78 != (_List_node_base *)0x0) &&
       (pmVar5 = std::
                 map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                 ::operator[](&this->m_DeviceInfoMap,(key_type *)&local_78), __mutex = local_70,
       pmVar5->HasDeviceAndHostTimer == true)) {
      lVar6 = std::chrono::_V2::steady_clock::now();
      local_50[0] = (undefined1 *)0x0;
      (*(this->m_Dispatch).clGetHostTimer)((cl_device_id)local_78,(cl_ulong *)local_50);
      lVar7 = std::chrono::_V2::steady_clock::now();
      *(undefined1 *)&p_Var1[5]._M_next = 1;
      p_Var1[5]._M_prev =
           (_List_node_base *)
           ((((ulong)(lVar7 - lVar6) >> 1) + lVar6) -
           (long)(local_50[0] + pmVar5->DeviceHostTimeDeltaNS));
      __mutex = local_70;
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::addTimingEvent(
    const char* functionName,
    const uint64_t enqueueCounter,
    const clock::time_point queuedTime,
    const std::string& tag,
    const cl_command_queue queue,
    cl_event event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( event == NULL )
    {
        logf( "Unexpectedly got a NULL timing event for %s, check for OpenCL errors!\n",
            functionName );
        return;
    }

    m_EventList.emplace_back();

    SEventListNode& node = m_EventList.back();

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    dispatch().clRetainEvent( event );

    node.Device = device;
    node.QueueNumber = m_QueueNumberMap[ queue ];
    node.Name = !tag.empty() ? tag : functionName;
    node.EnqueueCounter = enqueueCounter;
    node.QueuedTime = queuedTime;
    node.UseProfilingDelta = false;
    node.ProfilingDeltaNS = 0;
    node.Event = event;

    if( device )
    {
        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        // Note: Even though ideally the intercept timer and the host timer should advance
        // at a consistent rate and hence the delta between the two timers should remain
        // constant, empirically this does not appear to be the case.  Synchronizing the
        // two timers is relatively inexpensive, and reduces the timer drift, so compute
        // the current delta for each event.

        if( deviceInfo.HasDeviceAndHostTimer )
        {
            // These conditions should have been checked for HasDeviceAndHostTimer to be true:
            CLI_ASSERT( deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) );
            CLI_ASSERT( dispatch().clGetHostTimer );

            using ns = std::chrono::nanoseconds;
            const uint64_t  interceptTimeStartNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            cl_ulong    hostTimeNS = 0;
            dispatch().clGetHostTimer(
                device,
                &hostTimeNS);

            const uint64_t  interceptTimeEndNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            const int64_t   interceptHostTimeDeltaNS =
                ( interceptTimeEndNS - interceptTimeStartNS ) / 2 +
                ( interceptTimeStartNS - hostTimeNS );

            node.UseProfilingDelta = true;
            node.ProfilingDeltaNS =
                interceptHostTimeDeltaNS -
                deviceInfo.DeviceHostTimeDeltaNS;

            //logf( "Current Profiling Delta is %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept to Host Timer delta: %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept Start %llu ns, Intercept End %llu ns (delta %lld ns)\n"
            //    "\tHost %llu ns\n",
            //    node.ProfilingDeltaNS, node.ProfilingDeltaNS / 1000.0, node.ProfilingDeltaNS / 1000000.0,
            //    interceptHostTimeDeltaNS, interceptHostTimeDeltaNS / 1000.0, interceptHostTimeDeltaNS / 1000000.0,
            //    interceptTimeStartNS, interceptTimeEndNS, interceptTimeEndNS - interceptTimeStartNS,
            //    hostTimeNS );
        }
    }
}